

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

size_t __thiscall TxRequestTracker::Impl::CountCandidates(Impl *this,NodeId peer)

{
  __node_ptr p_Var1;
  size_t sVar2;
  long in_FS_OFFSET;
  NodeId local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = 0;
  local_18 = peer;
  p_Var1 = std::
           _Hashtable<long,_std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&(this->m_peerinfo)._M_h,
                          (ulong)peer % (this->m_peerinfo)._M_h._M_bucket_count,&local_18,
                          (__hash_code)&local_18);
  if (p_Var1 != (__node_ptr)0x0) {
    sVar2 = *(long *)((long)&(p_Var1->
                             super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                             ._M_storage._M_storage + 8) -
            (*(long *)((long)&(p_Var1->
                              super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                              ._M_storage._M_storage + 0x18) +
            *(long *)((long)&(p_Var1->
                             super__Hash_node_value<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>
                             ._M_storage._M_storage + 0x10));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountCandidates(NodeId peer) const
    {
        auto it = m_peerinfo.find(peer);
        if (it != m_peerinfo.end()) return it->second.m_total - it->second.m_requested - it->second.m_completed;
        return 0;
    }